

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardswish_x86_avx.cpp
# Opt level: O0

int __thiscall
ncnn::HardSwish_x86_avx::forward_inplace(HardSwish_x86_avx *this,Mat *bottom_top_blob,Option *opt)

{
  uint uVar1;
  float fVar2;
  float fVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  long lVar11;
  undefined1 auVar12 [24];
  int iVar13;
  long *in_RSI;
  long in_RDI;
  __m128 _ans_1;
  __m128 _p_1;
  __m128 _one;
  __m128 _zero;
  __m256 _ans;
  __m256 _p;
  __m256 _one_avx;
  __m256 _zero_avx;
  int i;
  float *ptr;
  int q;
  int size;
  int elempack;
  int channels;
  int d;
  int h;
  int w;
  Mat *m;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined1 local_600 [8];
  undefined8 uStack_5f8;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  float local_5e0;
  float fStack_5dc;
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  float fStack_5c4;
  int local_570;
  float *local_518;
  int local_50c;
  float local_3c0;
  float fStack_3bc;
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  float local_360;
  float fStack_35c;
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  undefined4 uStack_344;
  float local_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  float local_240;
  float fStack_23c;
  float fStack_238;
  float fStack_234;
  undefined8 uStack_130;
  undefined8 uStack_128;
  float local_80;
  float fStack_7c;
  float fStack_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  float fStack_64;
  
  lVar11 = in_RSI[7];
  iVar13 = *(int *)((long)in_RSI + 0x2c) * (int)in_RSI[6] * *(int *)((long)in_RSI + 0x34) *
           (int)in_RSI[3];
  for (local_50c = 0; local_50c < (int)lVar11; local_50c = local_50c + 1) {
    local_518 = (float *)(*in_RSI + in_RSI[8] * (long)local_50c * in_RSI[2]);
    local_570 = 0;
    auVar4 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
    auVar4 = vinsertps_avx(auVar4,ZEXT416(0x3f800000),0x20);
    auVar4 = vinsertps_avx(auVar4,ZEXT416(0x3f800000),0x30);
    auVar5 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
    auVar5 = vinsertps_avx(auVar5,ZEXT416(0x3f800000),0x20);
    auVar5 = vinsertps_avx(auVar5,ZEXT416(0x3f800000),0x30);
    uStack_130 = auVar4._0_8_;
    uStack_128 = auVar4._8_8_;
    for (; local_570 + 7 < iVar13; local_570 = local_570 + 8) {
      uVar1 = *(uint *)(in_RDI + 0xd4);
      auVar4 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
      auVar4 = vinsertps_avx(auVar4,ZEXT416(uVar1),0x20);
      auVar4 = vinsertps_avx(auVar4,ZEXT416(uVar1),0x30);
      auVar6 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
      auVar6 = vinsertps_avx(auVar6,ZEXT416(uVar1),0x20);
      auVar6 = vinsertps_avx(auVar6,ZEXT416(uVar1),0x30);
      uVar1 = *(uint *)(in_RDI + 0xd0);
      auVar7 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
      auVar7 = vinsertps_avx(auVar7,ZEXT416(uVar1),0x20);
      auVar7 = vinsertps_avx(auVar7,ZEXT416(uVar1),0x30);
      auVar8 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
      auVar8 = vinsertps_avx(auVar8,ZEXT416(uVar1),0x20);
      auVar8 = vinsertps_avx(auVar8,ZEXT416(uVar1),0x30);
      local_5e0 = (float)*(undefined8 *)local_518;
      fStack_5dc = (float)((ulong)*(undefined8 *)local_518 >> 0x20);
      fStack_5d8 = (float)*(undefined8 *)(local_518 + 2);
      fStack_5d4 = (float)((ulong)*(undefined8 *)(local_518 + 2) >> 0x20);
      fStack_5d0 = (float)*(undefined8 *)(local_518 + 4);
      fStack_5cc = (float)((ulong)*(undefined8 *)(local_518 + 4) >> 0x20);
      fStack_5c8 = (float)*(undefined8 *)(local_518 + 6);
      fStack_5c4 = (float)((ulong)*(undefined8 *)(local_518 + 6) >> 0x20);
      local_3c0 = auVar8._0_4_;
      fStack_3bc = auVar8._4_4_;
      fStack_3b8 = auVar8._8_4_;
      fStack_3b4 = auVar8._12_4_;
      fStack_3b0 = auVar7._0_4_;
      fStack_3ac = auVar7._4_4_;
      fStack_3a8 = auVar7._8_4_;
      local_80 = auVar4._0_4_;
      fStack_7c = auVar4._4_4_;
      fStack_78 = auVar4._8_4_;
      fStack_74 = auVar4._12_4_;
      fStack_70 = auVar6._0_4_;
      fStack_6c = auVar6._4_4_;
      fStack_68 = auVar6._8_4_;
      fStack_64 = auVar6._12_4_;
      local_600._4_4_ = fStack_5dc * fStack_3bc + fStack_7c;
      local_600._0_4_ = local_5e0 * local_3c0 + local_80;
      uStack_5f8._0_4_ = fStack_5d8 * fStack_3b8 + fStack_78;
      uStack_5f8._4_4_ = fStack_5d4 * fStack_3b4 + fStack_74;
      uStack_5f0._0_4_ = fStack_5d0 * fStack_3b0 + fStack_70;
      uStack_5f0._4_4_ = fStack_5cc * fStack_3ac + fStack_6c;
      uStack_5e8._0_4_ = fStack_5c8 * fStack_3a8 + fStack_68;
      uStack_5e8._4_4_ = fStack_5c4 + fStack_64;
      auVar9 = _local_600;
      uStack_5e8 = auVar9._24_8_;
      auVar9._16_8_ = uStack_5f0;
      auVar9._0_16_ = _local_600;
      auVar9._24_8_ = uStack_5e8;
      auVar9 = vmaxps_avx(auVar9,ZEXT1632(ZEXT816(0)));
      auVar10._16_8_ = uStack_130;
      auVar10._0_16_ = auVar5;
      auVar10._24_8_ = uStack_128;
      auVar9 = vminps_avx(auVar9,auVar10);
      local_360 = auVar9._0_4_;
      fStack_35c = auVar9._4_4_;
      fStack_358 = auVar9._8_4_;
      fStack_354 = auVar9._12_4_;
      fStack_350 = auVar9._16_4_;
      fStack_34c = auVar9._20_4_;
      fStack_348 = auVar9._24_4_;
      uStack_344 = auVar9._28_4_;
      local_600._4_4_ = fStack_35c * fStack_5dc;
      local_600._0_4_ = local_360 * local_5e0;
      uStack_5f8._0_4_ = fStack_358 * fStack_5d8;
      uStack_5f8._4_4_ = fStack_354 * fStack_5d4;
      uStack_5f0._0_4_ = fStack_350 * fStack_5d0;
      uStack_5f0._4_4_ = fStack_34c * fStack_5cc;
      auVar12 = _local_600;
      uStack_5e8._0_4_ = fStack_348 * fStack_5c8;
      uStack_5e8._4_4_ = uStack_344;
      auVar9 = _local_600;
      uStack_5f0 = auVar12._16_8_;
      uStack_5e8 = auVar9._24_8_;
      *(undefined1 (*) [8])local_518 = local_600;
      *(undefined8 *)(local_518 + 2) = uStack_5f8;
      *(undefined8 *)(local_518 + 4) = uStack_5f0;
      *(undefined8 *)(local_518 + 6) = uStack_5e8;
      local_518 = local_518 + 8;
    }
    for (; local_570 + 3 < iVar13; local_570 = local_570 + 4) {
      fVar2 = *(float *)(in_RDI + 0xd4);
      fVar3 = *(float *)(in_RDI + 0xd0);
      local_240 = (float)*(undefined8 *)local_518;
      fStack_23c = (float)((ulong)*(undefined8 *)local_518 >> 0x20);
      fStack_238 = (float)*(undefined8 *)(local_518 + 2);
      fStack_234 = (float)((ulong)*(undefined8 *)(local_518 + 2) >> 0x20);
      local_660 = CONCAT44(fStack_23c * fVar3 + fVar2,local_240 * fVar3 + fVar2);
      uStack_658._0_4_ = fStack_238 * fVar3 + fVar2;
      uStack_658._4_4_ = fStack_234 * fVar3 + fVar2;
      auVar4._8_8_ = uStack_658;
      auVar4._0_8_ = local_660;
      auVar4 = vmaxps_avx(auVar4,ZEXT816(0));
      auVar5._8_8_ = 0x3f8000003f800000;
      auVar5._0_8_ = 0x3f8000003f800000;
      auVar4 = vminps_avx(auVar4,auVar5);
      local_260 = auVar4._0_4_;
      fStack_25c = auVar4._4_4_;
      fStack_258 = auVar4._8_4_;
      fStack_254 = auVar4._12_4_;
      local_660 = CONCAT44(fStack_25c * fStack_23c,local_260 * local_240);
      uStack_658._0_4_ = fStack_258 * fStack_238;
      uStack_658._4_4_ = fStack_254 * fStack_234;
      *(undefined8 *)local_518 = local_660;
      *(undefined8 *)(local_518 + 2) = uStack_658;
      local_518 = local_518 + 4;
    }
    for (; local_570 < iVar13; local_570 = local_570 + 1) {
      if (*(float *)(in_RDI + 0xd8) <= *local_518) {
        if (*local_518 <= *(float *)(in_RDI + 0xdc)) {
          *local_518 = *local_518 *
                       (*local_518 * *(float *)(in_RDI + 0xd0) + *(float *)(in_RDI + 0xd4));
        }
      }
      else {
        *local_518 = 0.0;
      }
      local_518 = local_518 + 1;
    }
  }
  return 0;
}

Assistant:

int HardSwish_x86_avx::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _zero_avx512 = _mm512_setzero_ps();
        __m512 _one_avx512 = _mm512_set1_ps(1.f);
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _ans = _mm512_set1_ps(beta);
            _ans = _mm512_fmadd_ps(_p, _mm512_set1_ps(alpha), _ans);
            _ans = _mm512_max_ps(_ans, _zero_avx512);
            _ans = _mm512_min_ps(_ans, _one_avx512);
            _ans = _mm512_mul_ps(_ans, _p);
            _mm512_storeu_ps(ptr, _ans);
            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _zero_avx = _mm256_setzero_ps();
        __m256 _one_avx = _mm256_set1_ps(1.f);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _ans = _mm256_set1_ps(beta);
            _ans = _mm256_comp_fmadd_ps(_p, _mm256_set1_ps(alpha), _ans);
            _ans = _mm256_max_ps(_ans, _zero_avx);
            _ans = _mm256_min_ps(_ans, _one_avx);
            _ans = _mm256_mul_ps(_ans, _p);
            _mm256_storeu_ps(ptr, _ans);
            ptr += 8;
        }
#endif // __AVX__
        __m128 _zero = _mm_setzero_ps();
        __m128 _one = _mm_set1_ps(1.f);
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            __m128 _ans = _mm_set1_ps(beta);
            _ans = _mm_add_ps(_mm_mul_ps(_p, _mm_set1_ps(alpha)), _ans);
            _ans = _mm_max_ps(_ans, _zero);
            _ans = _mm_min_ps(_ans, _one);
            _ans = _mm_mul_ps(_ans, _p);
            _mm_store_ps(ptr, _ans);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            if (*ptr < lower)
                *ptr = 0.f;
            else if (*ptr > upper)
                ;
            else
                *ptr = *ptr * (*ptr * alpha + beta);
            ptr++;
        }
    }

    return 0;
}